

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

bool test_SSTableData_merge(void)

{
  allocator<SSTableDataEntry> *this;
  pointer *this_00;
  initializer_list<SSTableDataEntry> __l;
  initializer_list<SSTableDataEntry> __l_00;
  initializer_list<SSTableDataEntry> __l_01;
  initializer_list<SSTableDataEntry> __l_02;
  bool bVar1;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *pvVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  SSTableDataEntry *local_848;
  SSTableDataEntry *local_828;
  SSTableDataEntry *local_800;
  SSTableDataEntry *local_7d8;
  allocator<SSTableDataEntry> local_791;
  SSTableDataEntry *local_790;
  SSTableDataEntry local_788;
  SSTableDataEntry local_748;
  SSTableDataEntry local_708;
  SSTableDataEntry local_6c8;
  SSTableDataEntry local_688;
  SSTableDataEntry local_648;
  SSTableDataEntry local_608;
  SSTableDataEntry local_5c8;
  SSTableDataEntry local_588;
  SSTableDataEntry local_548;
  SSTableDataEntry local_508;
  SSTableDataEntry local_4c8;
  iterator local_488;
  size_type local_480;
  undefined1 local_478 [8];
  SSTableData baseline;
  SSTableData merged_data;
  SSTableDataEntry local_438;
  SSTableDataEntry local_3f8;
  SSTableDataEntry local_3b8;
  SSTableDataEntry local_378;
  SSTableDataEntry local_338;
  iterator local_2f8;
  size_type local_2f0;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *local_2e8;
  SSTableData *data3;
  SSTableDataEntry *local_2d8;
  SSTableDataEntry local_2d0;
  SSTableDataEntry local_290;
  SSTableDataEntry local_250;
  SSTableDataEntry local_210;
  SSTableDataEntry local_1d0;
  iterator local_190;
  size_type local_188;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *local_180;
  SSTableData *data2;
  SSTableDataEntry *local_168;
  SSTableDataEntry local_160;
  SSTableDataEntry local_120;
  SSTableDataEntry local_e0;
  SSTableDataEntry local_a0;
  SSTableDataEntry local_60;
  iterator local_20;
  size_type local_18;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *local_10;
  SSTableData *data1;
  
  pvVar2 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  data2._2_1_ = 1;
  local_168 = &local_160;
  SSTableDataEntry::SSTableDataEntry(local_168,false,0xbc614e,1,"Hello,World!");
  local_168 = &local_120;
  SSTableDataEntry::SSTableDataEntry(local_168,false,0x75bc702,2,"LLLLL");
  local_168 = &local_e0;
  SSTableDataEntry::SSTableDataEntry(local_168,false,0x4840e3f3,3,"asdasd");
  local_168 = &local_a0;
  SSTableDataEntry::SSTableDataEntry(local_168,false,0x75998cb,4,"NIMO");
  local_168 = &local_60;
  SSTableDataEntry::SSTableDataEntry(local_168,false,0x497ff7f0,10,"Hello,NIMO");
  local_20 = &local_160;
  local_18 = 5;
  std::allocator<SSTableDataEntry>::allocator((allocator<SSTableDataEntry> *)((long)&data2 + 3));
  __l_02._M_len = local_18;
  __l_02._M_array = local_20;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (pvVar2,__l_02,(allocator<SSTableDataEntry> *)((long)&data2 + 3));
  data2._2_1_ = 0;
  std::allocator<SSTableDataEntry>::~allocator((allocator<SSTableDataEntry> *)((long)&data2 + 3));
  local_7d8 = (SSTableDataEntry *)&local_20;
  do {
    local_7d8 = local_7d8 + -1;
    SSTableDataEntry::~SSTableDataEntry(local_7d8);
  } while (local_7d8 != &local_160);
  local_10 = pvVar2;
  pvVar2 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  data3._6_1_ = 1;
  local_2d8 = &local_2d0;
  SSTableDataEntry::SSTableDataEntry(local_2d8,false,0xbc614e,0,"Hello,World!");
  local_2d8 = &local_290;
  SSTableDataEntry::SSTableDataEntry(local_2d8,false,0x75bc703,2,"LLLLLL");
  local_2d8 = &local_250;
  SSTableDataEntry::SSTableDataEntry(local_2d8,true,0x4840e3f4,3,"");
  local_2d8 = &local_210;
  SSTableDataEntry::SSTableDataEntry(local_2d8,false,0x12d0e3,4,"NIMO!");
  local_2d8 = &local_1d0;
  SSTableDataEntry::SSTableDataEntry(local_2d8,false,0xbc28e1,0xf,"Hello,NIMO2");
  local_190 = &local_2d0;
  local_188 = 5;
  std::allocator<SSTableDataEntry>::allocator((allocator<SSTableDataEntry> *)((long)&data3 + 7));
  __l_01._M_len = local_188;
  __l_01._M_array = local_190;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (pvVar2,__l_01,(allocator<SSTableDataEntry> *)((long)&data3 + 7));
  data3._6_1_ = 0;
  std::allocator<SSTableDataEntry>::~allocator((allocator<SSTableDataEntry> *)((long)&data3 + 7));
  local_800 = (SSTableDataEntry *)&local_190;
  do {
    local_800 = local_800 + -1;
    SSTableDataEntry::~SSTableDataEntry(local_800);
  } while (local_800 != &local_2d0);
  local_180 = pvVar2;
  pvVar2 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  merged_data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  SSTableDataEntry::SSTableDataEntry(&local_438,false,0xbc614e,0x14,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_3f8,false,0x75bc703,0x16,"LLLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_3b8,true,0x4840e3f4,0x17,"");
  SSTableDataEntry::SSTableDataEntry(&local_378,false,0x12d0e3,0x18,"NIMO!");
  SSTableDataEntry::SSTableDataEntry(&local_338,false,0xbc28e1,0x19,"Hello,NIMO2");
  local_2f8 = &local_438;
  local_2f0 = 5;
  this = (allocator<SSTableDataEntry> *)
         ((long)&merged_data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<SSTableDataEntry>::allocator(this);
  __l_00._M_len = local_2f0;
  __l_00._M_array = local_2f8;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector(pvVar2,__l_00,this);
  merged_data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  std::allocator<SSTableDataEntry>::~allocator
            ((allocator<SSTableDataEntry> *)
             ((long)&merged_data.
                     super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  local_828 = (SSTableDataEntry *)&local_2f8;
  do {
    local_828 = local_828 + -1;
    SSTableDataEntry::~SSTableDataEntry(local_828);
  } while (local_828 != &local_438);
  local_2e8 = pvVar2;
  merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
            ((SSTableData *)
             &baseline.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_10,local_180,pvVar2);
  local_790 = &local_788;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0xbc614e,0,"Hello,World!");
  local_790 = &local_748;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0xbc614e,1,"Hello,World!");
  local_790 = &local_708;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0x75bc703,2,"LLLLLL");
  local_790 = &local_6c8;
  SSTableDataEntry::SSTableDataEntry(local_790,true,0x4840e3f4,3,"");
  local_790 = &local_688;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0x75998cb,4,"NIMO");
  local_790 = &local_648;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0x497ff7f0,10,"Hello,NIMO");
  local_790 = &local_608;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0xbc28e1,0xf,"Hello,NIMO2");
  local_790 = &local_5c8;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0xbc614e,0x14,"Hello,World!");
  local_790 = &local_588;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0x75bc703,0x16,"LLLLLL");
  local_790 = &local_548;
  SSTableDataEntry::SSTableDataEntry(local_790,true,0x4840e3f4,0x17,"");
  local_790 = &local_508;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0x12d0e3,0x18,"NIMO!");
  local_790 = &local_4c8;
  SSTableDataEntry::SSTableDataEntry(local_790,false,0xbc28e1,0x19,"Hello,NIMO2");
  local_488 = &local_788;
  local_480 = 0xc;
  std::allocator<SSTableDataEntry>::allocator(&local_791);
  __l._M_len = local_480;
  __l._M_array = local_488;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_478,__l,&local_791
            );
  std::allocator<SSTableDataEntry>::~allocator(&local_791);
  local_848 = (SSTableDataEntry *)&local_488;
  do {
    local_848 = local_848 + -1;
    SSTableDataEntry::~SSTableDataEntry(local_848);
  } while (local_848 != &local_788);
  this_00 = &baseline.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar3 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)this_00);
  iVar4 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::end
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)this_00);
  iVar5 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_478);
  iVar6 = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::end
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_478);
  bVar1 = std::
          equal<__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,__gnu_cxx::__normal_iterator<SSTableDataEntry*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>>,test_SSTableData_merge()::__0>
                    (iVar3._M_current,iVar4._M_current,iVar5._M_current,iVar6._M_current);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_478);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
             &baseline.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return bVar1;
}

Assistant:

bool test_SSTableData_merge() {
    auto *data1 = new SSTableData{
            {false, 12345678,   1,  "Hello,World!"},
            {false, 123455234,  2,  "LLLLL"},
            {false, 1212212211, 3,  "asdasd"},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 10, "Hello,NIMO"}
    };
    auto *data2 = new SSTableData{
            {false, 12345678,   0,  "Hello,World!"},
            {false, 123455235,  2,  "LLLLLL"},
            {true,  1212212212, 3,  ""},
            {false, 1233123,    4,  "NIMO!"},
            {false, 12331233,   15, "Hello,NIMO2"}
    };
    auto *data3 = new SSTableData{
            {false, 12345678,   20, "Hello,World!"},
            {false, 123455235,  22, "LLLLLL"},
            {true,  1212212212, 23, ""},
            {false, 1233123,    24, "NIMO!"},
            {false, 12331233,   25, "Hello,NIMO2"}
    };
    auto merged_data = SSTableData{merge(data1, data2, data3)};
    auto baseline = SSTableData{
            {false, 12345678,   0,  "Hello,World!"},
            {false, 12345678,   1,  "Hello,World!"},
            {false, 123455235,  2,  "LLLLLL"},
            {true,  1212212212, 3,  ""},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 10, "Hello,NIMO"},
            {false, 12331233,   15, "Hello,NIMO2"},
            {false, 12345678,   20, "Hello,World!"},
            {false, 123455235,  22, "LLLLLL"},
            {true,  1212212212, 23, ""},
            {false, 1233123,    24, "NIMO!"},
            {false, 12331233,   25, "Hello,NIMO2"}
    };
    return std::equal(merged_data.begin(), merged_data.end(), baseline.begin(), baseline.end(),
                      [](const SSTableDataEntry &e1, const SSTableDataEntry &e2) {
                          return e1.delete_flag == e2.delete_flag && e1.timestamp == e2.timestamp &&
                                 e1.value_length == e2.value_length && e1.value_length == e2.value_length &&
                                 e1.value == e2.value;
                      });
}